

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::MultisampleCase::renderTriangle
          (MultisampleCase *this,Vec3 *p0,Vec3 *p1,Vec3 *p2,Vec4 *c0,Vec4 *c1,Vec4 *c2)

{
  GLenum GVar1;
  deBool dVar2;
  deUint32 program;
  float local_98;
  float local_94;
  float vertexColors [12];
  float vertexPositions [12];
  Vec4 *c1_local;
  Vec4 *c0_local;
  Vec3 *p2_local;
  Vec3 *p1_local;
  Vec3 *p0_local;
  MultisampleCase *this_local;
  
  vertexColors[10] = tcu::Vector<float,_3>::x(p0);
  vertexColors[0xb] = tcu::Vector<float,_3>::y(p0);
  tcu::Vector<float,_3>::z(p0);
  tcu::Vector<float,_3>::x(p1);
  tcu::Vector<float,_3>::y(p1);
  tcu::Vector<float,_3>::z(p1);
  tcu::Vector<float,_3>::x(p2);
  tcu::Vector<float,_3>::y(p2);
  tcu::Vector<float,_3>::z(p2);
  local_98 = tcu::Vector<float,_4>::x(c0);
  local_94 = tcu::Vector<float,_4>::y(c0);
  vertexColors[0] = tcu::Vector<float,_4>::z(c0);
  vertexColors[1] = tcu::Vector<float,_4>::w(c0);
  vertexColors[2] = tcu::Vector<float,_4>::x(c1);
  vertexColors[3] = tcu::Vector<float,_4>::y(c1);
  vertexColors[4] = tcu::Vector<float,_4>::z(c1);
  vertexColors[5] = tcu::Vector<float,_4>::w(c1);
  vertexColors[6] = tcu::Vector<float,_4>::x(c2);
  vertexColors[7] = tcu::Vector<float,_4>::y(c2);
  vertexColors[8] = tcu::Vector<float,_4>::z(c2);
  vertexColors[9] = tcu::Vector<float,_4>::w(c2);
  do {
    glwEnableVertexAttribArray(this->m_attrPositionLoc);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glEnableVertexAttribArray(m_attrPositionLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0xf3);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glwVertexAttribPointer(this->m_attrPositionLoc,4,0x1406,'\0',0,vertexColors + 10);
    GVar1 = glwGetError();
    glu::checkError(GVar1,
                    "glVertexAttribPointer(m_attrPositionLoc, 4, GL_FLOAT, false, 0, &vertexPositions[0])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0xf4);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glwEnableVertexAttribArray(this->m_attrColorLoc);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glEnableVertexAttribArray(m_attrColorLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0xf6);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glwVertexAttribPointer(this->m_attrColorLoc,4,0x1406,'\0',0,&local_98);
    GVar1 = glwGetError();
    glu::checkError(GVar1,
                    "glVertexAttribPointer(m_attrColorLoc, 4, GL_FLOAT, false, 0, &vertexColors[0])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0xf7);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    program = glu::ShaderProgram::getProgram(this->m_program);
    glwUseProgram(program);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glUseProgram(m_program->getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0xf9);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glwDrawArrays(4,0,3);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glDrawArrays(GL_TRIANGLES, 0, 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0xfa);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  return;
}

Assistant:

void MultisampleCase::renderTriangle (const Vec3& p0, const Vec3& p1, const Vec3& p2, const Vec4& c0, const Vec4& c1, const Vec4& c2) const
{
	float vertexPositions[] =
	{
		p0.x(), p0.y(), p0.z(), 1.0f,
		p1.x(), p1.y(), p1.z(), 1.0f,
		p2.x(), p2.y(), p2.z(), 1.0f
	};
	float vertexColors[] =
	{
		c0.x(), c0.y(), c0.z(), c0.w(),
		c1.x(), c1.y(), c1.z(), c1.w(),
		c2.x(), c2.y(), c2.z(), c2.w(),
	};

	GLU_CHECK_CALL(glEnableVertexAttribArray(m_attrPositionLoc));
	GLU_CHECK_CALL(glVertexAttribPointer(m_attrPositionLoc, 4, GL_FLOAT, false, 0, &vertexPositions[0]));

	GLU_CHECK_CALL(glEnableVertexAttribArray(m_attrColorLoc));
	GLU_CHECK_CALL(glVertexAttribPointer(m_attrColorLoc, 4, GL_FLOAT, false, 0, &vertexColors[0]));

	GLU_CHECK_CALL(glUseProgram(m_program->getProgram()));
	GLU_CHECK_CALL(glDrawArrays(GL_TRIANGLES, 0, 3));
}